

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeTestTest.cpp
# Opt level: O2

void __thiscall SafeTestTest::SafeTestTest(SafeTestTest *this)

{
  pointer p_Var1;
  allocator<char> local_ca;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<oout::FunctionText,_std::allocator<oout::FunctionText>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_c8;
  shared_ptr<oout::FunctionText> local_b8;
  shared_ptr<oout::MatchTest> local_a8;
  shared_ptr<oout::EqualMatch> local_98;
  shared_ptr<const_oout::NamedTest> local_88;
  undefined1 local_78 [16];
  code *local_68;
  code *local_60;
  shared_ptr<oout::EqualMatch> local_50;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"SafeTest test",&local_ca);
  p_Var1 = std::
           allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<oout::FunctionText,_std::allocator<oout::FunctionText>,_(__gnu_cxx::_Lock_policy)2>_>_>
           ::allocate(&__a2,1);
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001cc228;
  local_78._0_8_ = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DronMDF[P]2out/test/SafeTestTest.cpp:22:7)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DronMDF[P]2out/test/SafeTestTest.cpp:22:7)>
             ::_M_manager;
  local_c8._M_alloc = &__a2;
  local_c8._M_ptr = p_Var1;
  oout::FunctionText::FunctionText
            ((FunctionText *)&p_Var1->_M_impl,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)local_78);
  std::_Function_base::~_Function_base((_Function_base *)local_78);
  local_c8._M_ptr = (pointer)0x0;
  local_50.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&p_Var1->_M_impl;
  local_50.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       &p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<oout::FunctionText,_std::allocator<oout::FunctionText>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_c8);
  std::make_shared<oout::EqualMatch,char_const(&)[5]>((char (*) [5])local_78);
  std::
  make_shared<oout::MatchTest,std::shared_ptr<oout::FunctionText>,std::shared_ptr<oout::EqualMatch>>
            (&local_b8,&local_50);
  std::make_shared<oout::SafeTest,std::shared_ptr<oout::MatchTest>>(&local_a8);
  std::make_shared<TestText,std::shared_ptr<oout::SafeTest>>
            ((shared_ptr<oout::SafeTest> *)&local_98);
  std::make_shared<oout::EqualMatch,char_const(&)[6]>((char (*) [6])&local_c8);
  std::
  make_shared<oout::NamedTest_const,char_const(&)[46],std::shared_ptr<TestText>,std::shared_ptr<oout::EqualMatch>>
            ((char (*) [46])&local_88,
             (shared_ptr<TestText> *)"SafeTest produce error if exceprion are throw",&local_98);
  oout::dirty::Test::Test<std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_40,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<oout::MatchTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<oout::FunctionText,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_001cc898;
  return;
}

Assistant:

SafeTestTest::SafeTestTest()
: dirty::Test(
	"SafeTest test",
	make_shared<const NamedTest>(
		"SafeTest produce error if exceprion are throw",
		make_shared<TestText>(
			make_shared<SafeTest>(
				make_shared<MatchTest>(
					make_shared<FunctionText>(
						[]() -> string {
							throw runtime_error("Shit");
						}
					),
					make_shared<EqualMatch>("Good")  // Not happen
				)
			)
		),
		make_shared<EqualMatch>("error")
	)
)
{
}